

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.c
# Opt level: O0

void fill_lock_region(LockRegion *lr,float alphafactor,_Bool blended)

{
  byte in_SIL;
  int *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  ulong uVar4;
  ALLEGRO_COLOR c;
  float a;
  float b;
  float g;
  float r;
  int y;
  int x;
  int local_18;
  int local_14;
  
  for (local_18 = 0; local_18 < in_RDI[3]; local_18 = local_18 + 1) {
    for (local_14 = 0; local_14 < in_RDI[2]; local_14 = local_14 + 1) {
      fVar1 = (float)local_14 / (float)(in_RDI[2] + -1);
      fVar2 = (float)local_18 / (float)(in_RDI[3] + -1);
      uVar4 = (ulong)(uint)(fVar1 * fVar2);
      uVar3 = al_map_rgba_f(fVar1,uVar4,fVar2,fVar1 * in_XMM0_Da);
      if ((in_SIL & 1) == 0) {
        al_put_pixel(uVar3,uVar4,*in_RDI + local_14,in_RDI[1] + local_18);
      }
      else {
        al_put_blended_pixel(uVar3,uVar4,*in_RDI + local_14,in_RDI[1] + local_18);
      }
    }
  }
  return;
}

Assistant:

static void fill_lock_region(LockRegion *lr, float alphafactor, bool blended)
{
   int x, y;
   float r, g, b, a;
   ALLEGRO_COLOR c;

   for (y = 0; y < lr->h; y++) {
      for (x = 0; x < lr->w; x++) {
         /* -1 to make the last pixel use the full color, allows easier
          * manual inspection of the test results as we have a fixed
          * color on each side.
          */
         r = (float)x / (lr->w - 1);
         b = (float)y / (lr->h - 1);
         g = r*b;
         a = r * alphafactor;
         c = al_map_rgba_f(r, g, b, a);
         if (blended)
            al_put_blended_pixel(lr->x + x, lr->y + y, c);
         else
            al_put_pixel(lr->x + x, lr->y + y, c);
      }
   }
}